

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::FileDescriptorProto::InternalSerializeWithCachedSizesToArray
          (FileDescriptorProto *this,bool deterministic,uint8 *target)

{
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_01;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *this_02;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_03;
  int iVar1;
  string *psVar2;
  char *data;
  FileOptions *this_04;
  SourceCodeInfo *this_05;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  FileDescriptorProto *pFVar6;
  uint uVar7;
  Type *pTVar8;
  Type *this_06;
  Type *this_07;
  Type *this_08;
  Type *this_09;
  LogMessage *pLVar9;
  Rep *pRVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  undefined7 in_register_00000031;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  byte *pbVar18;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_10;
  LogFinisher local_79;
  FileDescriptorProto *local_78;
  undefined4 local_70;
  uint local_6c;
  LogMessage local_68;
  
  uVar13 = (this->_has_bits_).has_bits_[0];
  local_70 = (undefined4)CONCAT71(in_register_00000031,deterministic);
  if ((uVar13 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.name");
    psVar2 = (this->name_).ptr_;
    *target = '\n';
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  if ((uVar13 & 2) != 0) {
    psVar2 = (this->package_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.package");
    psVar2 = (this->package_).ptr_;
    *target = 0x12;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  iVar1 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  local_78 = this;
  local_6c = uVar13;
  if (0 < iVar1) {
    this_10 = &this->dependency_;
    iVar17 = 0;
    do {
      pTVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_10->super_RepeatedPtrFieldBase,iVar17);
      data = (pTVar8->_M_dataplus)._M_p;
      pTVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_10->super_RepeatedPtrFieldBase,iVar17);
      internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar8->_M_string_length,SERIALIZE,
                 "google.protobuf.FileDescriptorProto.dependency");
      pTVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_10->super_RepeatedPtrFieldBase,iVar17);
      *target = 0x1a;
      target = io::CodedOutputStream::WriteStringWithSizeToArray(pTVar8,target + 1);
      iVar17 = iVar17 + 1;
    } while (iVar1 != iVar17);
  }
  iVar1 = (local_78->message_type_).super_RepeatedPtrFieldBase.current_size_;
  bVar5 = local_70._0_1_;
  if (iVar1 != 0) {
    this_00 = &local_78->message_type_;
    iVar17 = 0;
    do {
      this_06 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                          (&this_00->super_RepeatedPtrFieldBase,iVar17);
      *target = 0x22;
      pbVar18 = target + 1;
      uVar13 = this_06->_cached_size_;
      uVar11 = uVar13;
      if (0x7f < uVar13) {
        do {
          *pbVar18 = (byte)uVar13 | 0x80;
          uVar11 = uVar13 >> 7;
          pbVar18 = pbVar18 + 1;
          bVar4 = 0x3fff < uVar13;
          uVar13 = uVar11;
        } while (bVar4);
      }
      *pbVar18 = (byte)uVar11;
      target = DescriptorProto::InternalSerializeWithCachedSizesToArray(this_06,bVar5,pbVar18 + 1);
      iVar17 = iVar17 + 1;
    } while (iVar17 != iVar1);
  }
  iVar1 = (local_78->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    this_01 = &local_78->enum_type_;
    iVar17 = 0;
    do {
      this_07 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                          (&this_01->super_RepeatedPtrFieldBase,iVar17);
      *target = 0x2a;
      pbVar18 = target + 1;
      uVar13 = this_07->_cached_size_;
      uVar11 = uVar13;
      if (0x7f < uVar13) {
        do {
          *pbVar18 = (byte)uVar13 | 0x80;
          uVar11 = uVar13 >> 7;
          pbVar18 = pbVar18 + 1;
          bVar4 = 0x3fff < uVar13;
          uVar13 = uVar11;
        } while (bVar4);
      }
      *pbVar18 = (byte)uVar11;
      target = EnumDescriptorProto::InternalSerializeWithCachedSizesToArray
                         (this_07,bVar5,pbVar18 + 1);
      iVar17 = iVar17 + 1;
    } while (iVar17 != iVar1);
  }
  iVar1 = (local_78->service_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    this_02 = &local_78->service_;
    iVar17 = 0;
    do {
      this_08 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                          (&this_02->super_RepeatedPtrFieldBase,iVar17);
      *target = 0x32;
      pbVar18 = target + 1;
      uVar13 = this_08->_cached_size_;
      uVar11 = uVar13;
      if (0x7f < uVar13) {
        do {
          *pbVar18 = (byte)uVar13 | 0x80;
          uVar11 = uVar13 >> 7;
          pbVar18 = pbVar18 + 1;
          bVar4 = 0x3fff < uVar13;
          uVar13 = uVar11;
        } while (bVar4);
      }
      *pbVar18 = (byte)uVar11;
      target = ServiceDescriptorProto::InternalSerializeWithCachedSizesToArray
                         (this_08,bVar5,pbVar18 + 1);
      iVar17 = iVar17 + 1;
    } while (iVar17 != iVar1);
  }
  iVar1 = (local_78->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    this_03 = &local_78->extension_;
    iVar17 = 0;
    do {
      this_09 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                          (&this_03->super_RepeatedPtrFieldBase,iVar17);
      *target = 0x3a;
      pbVar18 = target + 1;
      uVar13 = this_09->_cached_size_;
      uVar11 = uVar13;
      if (0x7f < uVar13) {
        do {
          *pbVar18 = (byte)uVar13 | 0x80;
          uVar11 = uVar13 >> 7;
          pbVar18 = pbVar18 + 1;
          bVar4 = 0x3fff < uVar13;
          uVar13 = uVar11;
        } while (bVar4);
      }
      *pbVar18 = (byte)uVar11;
      target = FieldDescriptorProto::InternalSerializeWithCachedSizesToArray
                         (this_09,bVar5,pbVar18 + 1);
      iVar17 = iVar17 + 1;
    } while (iVar17 != iVar1);
  }
  uVar13 = local_6c;
  pFVar6 = local_78;
  if ((local_6c & 8) != 0) {
    this_04 = local_78->options_;
    *target = 0x42;
    pbVar18 = target + 1;
    uVar11 = this_04->_cached_size_;
    uVar7 = uVar11;
    if (0x7f < uVar11) {
      do {
        *pbVar18 = (byte)uVar11 | 0x80;
        uVar7 = uVar11 >> 7;
        pbVar18 = pbVar18 + 1;
        bVar4 = 0x3fff < uVar11;
        uVar11 = uVar7;
      } while (bVar4);
    }
    *pbVar18 = (byte)uVar7;
    target = FileOptions::InternalSerializeWithCachedSizesToArray(this_04,bVar5,pbVar18 + 1);
  }
  if ((uVar13 & 0x10) != 0) {
    this_05 = pFVar6->source_code_info_;
    *target = 0x4a;
    pbVar18 = target + 1;
    uVar11 = this_05->_cached_size_;
    uVar7 = uVar11;
    if (0x7f < uVar11) {
      do {
        *pbVar18 = (byte)uVar11 | 0x80;
        uVar7 = uVar11 >> 7;
        pbVar18 = pbVar18 + 1;
        bVar5 = 0x3fff < uVar11;
        uVar11 = uVar7;
      } while (bVar5);
    }
    *pbVar18 = (byte)uVar7;
    target = SourceCodeInfo::InternalSerializeWithCachedSizesToArray(this_05,false,pbVar18 + 1);
  }
  uVar11 = (pFVar6->public_dependency_).current_size_;
  if (uVar11 != 0) {
    pRVar10 = (pFVar6->public_dependency_).rep_;
    if (pRVar10 == (Rep *)0x0) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar9 = internal::LogMessage::operator<<(&local_68,"CHECK failed: rep_: ");
      internal::LogFinisher::operator=(&local_79,pLVar9);
      internal::LogMessage::~LogMessage(&local_68);
      pRVar10 = (pFVar6->public_dependency_).rep_;
    }
    uVar12 = 1;
    if (1 < (int)uVar11) {
      uVar12 = (ulong)uVar11;
    }
    uVar14 = 0;
    do {
      uVar15 = (ulong)pRVar10->elements[uVar14];
      pbVar18 = target + 1;
      *target = 0x50;
      uVar16 = uVar15;
      if (0x7f < uVar15) {
        do {
          *pbVar18 = (byte)uVar15 | 0x80;
          uVar16 = uVar15 >> 7;
          pbVar18 = pbVar18 + 1;
          bVar5 = 0x3fff < uVar15;
          uVar15 = uVar16;
        } while (bVar5);
      }
      *pbVar18 = (byte)uVar16;
      target = pbVar18 + 1;
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar12);
  }
  uVar11 = (pFVar6->weak_dependency_).current_size_;
  if (uVar11 != 0) {
    pRVar10 = (pFVar6->weak_dependency_).rep_;
    if (pRVar10 == (Rep *)0x0) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar9 = internal::LogMessage::operator<<(&local_68,"CHECK failed: rep_: ");
      internal::LogFinisher::operator=(&local_79,pLVar9);
      internal::LogMessage::~LogMessage(&local_68);
      pRVar10 = (pFVar6->weak_dependency_).rep_;
    }
    uVar12 = 1;
    if (1 < (int)uVar11) {
      uVar12 = (ulong)uVar11;
    }
    uVar14 = 0;
    do {
      uVar15 = (ulong)pRVar10->elements[uVar14];
      pbVar18 = target + 1;
      *target = 0x58;
      uVar16 = uVar15;
      if (0x7f < uVar15) {
        do {
          *pbVar18 = (byte)uVar15 | 0x80;
          uVar16 = uVar15 >> 7;
          pbVar18 = pbVar18 + 1;
          bVar5 = 0x3fff < uVar15;
          uVar15 = uVar16;
        } while (bVar5);
      }
      *pbVar18 = (byte)uVar16;
      target = pbVar18 + 1;
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar12);
  }
  if ((uVar13 & 4) != 0) {
    psVar2 = (pFVar6->syntax_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.syntax");
    psVar2 = (pFVar6->syntax_).ptr_;
    *target = 0x62;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  pvVar3 = (pFVar6->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    target = internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* FileDescriptorProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string package = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->package().data(), this->package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.package");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->package(), target);
  }

  // repeated string dependency = 3;
  for (int i = 0, n = this->dependency_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->dependency(i).data(), this->dependency(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.dependency");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->dependency(i), target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (unsigned int i = 0, n = this->message_type_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        4, this->message_type(i), deterministic, target);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (unsigned int i = 0, n = this->enum_type_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        5, this->enum_type(i), deterministic, target);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (unsigned int i = 0, n = this->service_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, this->service(i), deterministic, target);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (unsigned int i = 0, n = this->extension_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        7, this->extension(i), deterministic, target);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        8, *this->options_, deterministic, target);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        9, *this->source_code_info_, deterministic, target);
  }

  // repeated int32 public_dependency = 10;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteInt32ToArray(10, this->public_dependency_, target);

  // repeated int32 weak_dependency = 11;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteInt32ToArray(11, this->weak_dependency_, target);

  // optional string syntax = 12;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->syntax().data(), this->syntax().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.syntax");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        12, this->syntax(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileDescriptorProto)
  return target;
}